

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_array.h
# Opt level: O0

void __thiscall
webrtc::AlignedArray<std::complex<float>_>::AlignedArray
          (AlignedArray<std::complex<float>_> *this,size_t rows,size_t cols,size_t alignment)

{
  complex<float> **ppcVar1;
  complex<float> *pcVar2;
  ulong local_1b8;
  size_t i;
  uint local_34;
  string *local_30;
  string *_result;
  size_t alignment_local;
  size_t cols_local;
  size_t rows_local;
  AlignedArray<std::complex<float>_> *this_local;
  
  this->rows_ = rows;
  this->cols_ = cols;
  local_34 = 0;
  _result = (string *)alignment;
  alignment_local = cols;
  cols_local = rows;
  rows_local = (size_t)this;
  local_30 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       ((unsigned_long *)&_result,&local_34,"alignment > 0u");
  if (local_30 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/system_wrappers/include/aligned_array.h"
               ,0x1a,local_30);
    rtc::FatalMessage::stream((FatalMessage *)&i);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&i);
  }
  ppcVar1 = (complex<float> **)AlignedMalloc(this->rows_ << 3,(size_t)_result);
  this->head_row_ = ppcVar1;
  for (local_1b8 = 0; local_1b8 < this->rows_; local_1b8 = local_1b8 + 1) {
    pcVar2 = (complex<float> *)AlignedMalloc(this->cols_ << 3,(size_t)_result);
    this->head_row_[local_1b8] = pcVar2;
  }
  return;
}

Assistant:

AlignedArray(size_t rows, size_t cols, size_t alignment)
      : rows_(rows),
        cols_(cols) {
    RTC_CHECK_GT(alignment, 0u);
    head_row_ = static_cast<T**>(AlignedMalloc(rows_ * sizeof(*head_row_),
                                               alignment));
    for (size_t i = 0; i < rows_; ++i) {
      head_row_[i] = static_cast<T*>(AlignedMalloc(cols_ * sizeof(**head_row_),
                                                   alignment));
    }
  }